

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O3

bool __thiscall FConfigFile::SetSection(FConfigFile *this,char *name,bool allowCreate)

{
  bool bVar1;
  int iVar2;
  FConfigSection *pFVar3;
  
  for (pFVar3 = this->Sections; pFVar3 != (FConfigSection *)0x0; pFVar3 = pFVar3->Next) {
    iVar2 = strcasecmp((pFVar3->SectionName).Chars,name);
    if (iVar2 == 0) goto LAB_004af6be;
  }
  if (allowCreate) {
    pFVar3 = NewConfigSection(this,name);
LAB_004af6be:
    this->CurrentSection = pFVar3;
    this->CurrentEntry = pFVar3->RootEntry;
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool FConfigFile::SetSection (const char *name, bool allowCreate)
{
	FConfigSection *section = FindSection (name);
	if (section == NULL && allowCreate)
	{
		section = NewConfigSection (name);
	}
	if (section != NULL)
	{
		CurrentSection = section;
		CurrentEntry = section->RootEntry;
		return true;
	}
	return false;
}